

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O1

int pkcs7_verify_unwrap(scep *s,char *cachainfile)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint len;
  BIO_METHOD *pBVar4;
  BIO *pBVar5;
  PKCS7 *pPVar6;
  char **b;
  stack_st_PKCS7_SIGNER_INFO *psVar7;
  FILE *pFVar8;
  FILE *pFVar9;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *pFVar10;
  PKCS7 *pPVar11;
  FILE *b_00;
  size_t __n;
  X509 **ppXVar12;
  ulong uVar13;
  void *__src;
  char *pcVar14;
  ASN1_OBJECT *a;
  ASN1_TYPE *pAVar15;
  FILE *pFVar16;
  X509_NAME *pXVar17;
  X509_NAME *b_01;
  X509 *a_00;
  X509_EXTENSION *pXVar18;
  ulong uVar19;
  char **ppcVar20;
  EVP_PKEY **buffer_00;
  ulong uVar21;
  uint extraout_EDX;
  FILE *extraout_RDX;
  undefined8 uVar22;
  FILE *pFVar23;
  char *pcVar24;
  char *pcVar25;
  int *piVar26;
  int *cert;
  long lVar27;
  char **ppcVar28;
  uchar buffer [1024];
  uint uStack_260c;
  PKCS7 *pPStack_2608;
  BIO *pBStack_2600;
  long lStack_25f8;
  byte abStack_25f0 [64];
  char acStack_25b0 [1024];
  char acStack_21b0 [1032];
  FILE *pFStack_1da8;
  int *piStack_1da0;
  FILE *pFStack_1d98;
  FILE *pFStack_1d90;
  FILE *pFStack_1d88;
  FILE *pFStack_1d80;
  FILE *pFStack_1d70;
  FILE aFStack_1d68 [4];
  FILE *pFStack_1960;
  int *piStack_1958;
  FILE *pFStack_1950;
  FILE *pFStack_1948;
  FILE *pFStack_1940;
  FILE *pFStack_1938;
  FILE aFStack_1930 [4];
  FILE aFStack_1530 [4];
  char acStack_1130 [2056];
  FILE *pFStack_928;
  FILE *pFStack_920;
  FILE *pFStack_918;
  FILE *pFStack_910;
  FILE *pFStack_908;
  FILE *pFStack_900;
  FILE *pFStack_8f0;
  FILE *pFStack_8e8;
  FILE *pFStack_8e0;
  FILE *pFStack_8d8;
  FILE *pFStack_8d0;
  FILE *pFStack_8c8;
  code *pcStack_8c0;
  FILE *pFStack_8b0;
  FILE *pFStack_8a8;
  FILE *pFStack_8a0;
  FILE *pFStack_898;
  FILE *pFStack_890;
  FILE *pFStack_888;
  undefined1 auStack_878 [1040];
  scep *psStack_468;
  FILE *pFStack_460;
  X509_STORE *pXStack_458;
  X509_STORE_CTX *pXStack_450;
  FILE *pFStack_448;
  FILE *pFStack_440;
  undefined1 auStack_438 [1032];
  
  pFStack_440 = (FILE *)0x10cca2;
  pBVar4 = BIO_s_mem();
  pFStack_440 = (FILE *)0x10ccaa;
  pBVar5 = BIO_new(pBVar4);
  if (v_flag != 0) {
    pFStack_440 = (FILE *)0x10ccd1;
    printf("%s: reading outer PKCS#7\n",pname);
  }
  pFStack_440 = (FILE *)0x10cce6;
  uVar2 = BIO_write(pBVar5,s->reply_payload,s->reply_len);
  if ((int)uVar2 < 1) {
    pFStack_440 = (FILE *)0x10d070;
    pkcs7_verify_unwrap_cold_12();
LAB_0010d070:
    pFStack_440 = (FILE *)0x10d075;
    pkcs7_verify_unwrap_cold_11();
LAB_0010d075:
    pFStack_440 = (FILE *)0x10d07a;
    pkcs7_verify_unwrap_cold_1();
LAB_0010d07a:
    pFStack_440 = (FILE *)0x10d07f;
    pkcs7_verify_unwrap_cold_10();
  }
  else {
    if (v_flag != 0) {
      pFStack_440 = (FILE *)0x10cd14;
      printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar2);
    }
    pFStack_440 = (FILE *)0x10cd21;
    BIO_set_flags(pBVar5,0x200);
    pFStack_440 = (FILE *)0x10cd2b;
    pPVar6 = (PKCS7 *)d2i_PKCS7_bio(pBVar5,(PKCS7 **)0x0);
    s->reply_p7 = pPVar6;
    if (pPVar6 == (PKCS7 *)0x0) goto LAB_0010d070;
    if (d_flag != 0) {
      pFStack_440 = (FILE *)0x10cd5f;
      printf("%s: printing PEM fomatted PKCS#7\n",pname);
      pFStack_440 = (FILE *)0x10cd75;
      PEM_write_PKCS7(_stdout,(PKCS7 *)s->reply_p7);
    }
    pFStack_440 = (FILE *)0x10cd85;
    iVar3 = OBJ_obj2nid((ASN1_OBJECT *)s->reply_p7->type);
    if (iVar3 != 0x16) goto LAB_0010d075;
    pFStack_440 = (FILE *)0x10cd9c;
    pBVar5 = PKCS7_dataInit((PKCS7 *)s->reply_p7,(BIO *)0x0);
    if (pBVar5 == (BIO *)0x0) goto LAB_0010d07a;
    pFStack_440 = (FILE *)0x10cdad;
    pBVar4 = BIO_s_mem();
    pFStack_440 = (FILE *)0x10cdb5;
    b = (char **)BIO_new(pBVar4);
    pFStack_440 = (FILE *)0x10cdc8;
    uVar2 = BIO_read(pBVar5,auStack_438,0x400);
    len = uVar2;
    while (0 < (int)len) {
      pFStack_440 = (FILE *)0x10cde0;
      BIO_write((BIO *)b,auStack_438,len);
      pFStack_440 = (FILE *)0x10cdf0;
      len = BIO_read(pBVar5,auStack_438,0x400);
      uVar2 = uVar2 + len;
    }
    pFStack_440 = (FILE *)0x10ce07;
    BIO_ctrl((BIO *)b,0xb,0,(void *)0x0);
    if (v_flag != 0) {
      pFStack_440 = (FILE *)0x10ce2d;
      printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)uVar2);
    }
    pFStack_440 = (FILE *)0x10ce39;
    psVar7 = PKCS7_get_signer_info((PKCS7 *)s->reply_p7);
    if (psVar7 != (stack_st_PKCS7_SIGNER_INFO *)0x0) {
      if (v_flag != 0) {
        pFStack_440 = (FILE *)0x10ce69;
        printf("%s: verifying signature\n",pname);
      }
      pFStack_440 = (FILE *)0x10ce73;
      pFVar8 = (FILE *)OPENSSL_sk_value(psVar7,0);
      pFStack_440 = (FILE *)0x10ce85;
      pFVar9 = (FILE *)PKCS7_cert_from_signer_info((PKCS7 *)s->reply_p7,(PKCS7_SIGNER_INFO *)pFVar8)
      ;
      if (pFVar9 == (FILE *)0x0) {
        pFStack_440 = (FILE *)0x10cea5;
        printf("%s: Can\'t read signer cert from pkcs7\n",pname);
      }
      pFStack_440 = (FILE *)0x10ceba;
      iVar3 = PKCS7_signatureVerify
                        (pBVar5,(PKCS7 *)s->reply_p7,(PKCS7_SIGNER_INFO *)pFVar8,(X509 *)pFVar9);
      if (iVar3 < 1) goto LAB_0010d084;
      if (v_flag != 0) {
        pFStack_440 = (FILE *)0x10cee6;
        printf("%s: signature ok\n");
      }
      pFStack_440 = (FILE *)0x10ceeb;
      ctx = X509_STORE_new();
      if (ctx == (X509_STORE *)0x0) {
        pFStack_440 = (FILE *)0x10d048;
        pkcs7_verify_unwrap_cold_2();
      }
      pFStack_440 = (FILE *)0x10cf01;
      X509_STORE_set_flags(ctx,0);
      pFStack_440 = (FILE *)0x10cf0e;
      X509_STORE_load_locations(ctx,cachainfile,(char *)0x0);
      pFStack_440 = (FILE *)0x10cf13;
      ctx_00 = X509_STORE_CTX_new();
      if (ctx_00 == (X509_STORE_CTX *)0x0) {
        pFStack_440 = (FILE *)0x10d052;
        pkcs7_verify_unwrap_cold_3();
      }
      buffer_00 = (EVP_PKEY **)0x0;
      pFStack_440 = (FILE *)0x10cf2f;
      iVar3 = X509_STORE_CTX_init(ctx_00,ctx,(X509 *)pFVar9,(stack_st_X509 *)0x0);
      if (iVar3 == 0) {
        pFStack_440 = (FILE *)0x10d05c;
        pkcs7_verify_unwrap_cold_4();
      }
      pFStack_440 = (FILE *)0x10cf3f;
      iVar3 = X509_verify_cert(ctx_00);
      if (iVar3 == 0) {
        pFStack_440 = (FILE *)0x10d066;
        pkcs7_verify_unwrap_cold_5();
      }
      pFVar10 = pFVar8;
      if (w_flag == 0) {
LAB_0010d005:
        pFStack_440 = (FILE *)0x10d00f;
        pFVar16 = (FILE *)b;
        pPVar6 = (PKCS7 *)d2i_PKCS7_bio((BIO *)b,(PKCS7 **)0x0);
        s->reply_p7 = pPVar6;
        if (pPVar6 != (PKCS7 *)0x0) {
          pFStack_440 = (FILE *)0x10d027;
          X509_STORE_free(ctx);
          pFStack_440 = (FILE *)0x10d02f;
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        pFStack_440 = (FILE *)0x10d0ba;
        pkcs7_verify_unwrap_cold_8();
        pFVar8 = pFVar10;
LAB_0010d0ba:
        pFVar10 = pFVar8;
        pFStack_440 = (FILE *)0x10d0bf;
        pkcs7_verify_unwrap_cold_7();
      }
      else {
        pFStack_440 = (FILE *)0x10cf6d;
        pFVar16 = (FILE *)w_char;
        pFVar10 = fopen(w_char,"w");
        if (pFVar10 == (FILE *)0x0) goto LAB_0010d0ba;
        if (v_flag != 0) {
          pFStack_440 = (FILE *)0x10cf9d;
          printf("%s: writing cert\n",w_char);
        }
        if (d_flag != 0) {
          pFStack_440 = (FILE *)0x10cfbb;
          PEM_write_X509(_stdout,(X509 *)pFVar9);
        }
        pFStack_440 = (FILE *)0x10cfc6;
        pFVar16 = pFVar10;
        iVar3 = PEM_write_X509(pFVar10,(X509 *)pFVar9);
        if (iVar3 == 1) {
          if (v_flag != 0) {
            pFStack_440 = (FILE *)0x10cffd;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          pFStack_440 = (FILE *)0x10d005;
          fclose(pFVar10);
          goto LAB_0010d005;
        }
      }
      pFStack_440 = (FILE *)pkcs7_unwrap;
      pkcs7_verify_unwrap_cold_6();
      pFStack_888 = (FILE *)0x10d0dd;
      psStack_468 = s;
      pFStack_460 = pFVar9;
      pXStack_458 = ctx;
      pXStack_450 = ctx_00;
      pFStack_448 = (FILE *)b;
      pFStack_440 = pFVar10;
      pBVar4 = BIO_s_mem();
      pFStack_888 = (FILE *)0x10d0e5;
      pFVar8 = (FILE *)BIO_new(pBVar4);
      cert = &v_flag;
      if (v_flag != 0) {
        pFStack_888 = (FILE *)0x10d10e;
        printf("%s: reading outer PKCS#7\n",pname);
      }
      pFVar23 = *(FILE **)&pFVar16->_mode;
      pFStack_888 = (FILE *)0x10d123;
      pcVar24 = (char *)pFVar8;
      uVar2 = BIO_write((BIO *)pFVar8,pFVar23,*(int *)(pFVar16->_unused2 + 4));
      if ((int)uVar2 < 1) {
        pFStack_888 = (FILE *)0x10d77a;
        pkcs7_unwrap_cold_21();
LAB_0010d77a:
        pFStack_888 = (FILE *)0x10d77f;
        pkcs7_unwrap_cold_1();
LAB_0010d77f:
        pFStack_888 = (FILE *)0x10d784;
        pkcs7_unwrap_cold_20();
LAB_0010d784:
        pFStack_888 = (FILE *)0x10d789;
        pkcs7_unwrap_cold_19();
LAB_0010d789:
        pFStack_888 = (FILE *)0x10d78e;
        pkcs7_unwrap_cold_18();
LAB_0010d78e:
        pFStack_888 = (FILE *)0x10d793;
        pkcs7_unwrap_cold_17();
LAB_0010d793:
        pcVar25 = (char *)pFVar9;
        pFStack_888 = (FILE *)0x10d798;
        pkcs7_unwrap_cold_2();
LAB_0010d798:
        pFStack_888 = (FILE *)0x10d79d;
        pkcs7_unwrap_cold_3();
LAB_0010d79d:
        pFStack_888 = (FILE *)0x10d7a2;
        pkcs7_unwrap_cold_4();
LAB_0010d7a2:
        pFStack_888 = (FILE *)0x10d7a7;
        pkcs7_unwrap_cold_5();
LAB_0010d7a7:
        pFStack_888 = (FILE *)0x10d7ac;
        pkcs7_unwrap_cold_7();
LAB_0010d7ac:
        pFStack_888 = (FILE *)0x10d7b1;
        pkcs7_unwrap_cold_9();
LAB_0010d7b1:
        pFStack_888 = (FILE *)0x10d7b6;
        pkcs7_unwrap_cold_10();
LAB_0010d7b6:
        pFStack_888 = (FILE *)0x10d7bb;
        pkcs7_unwrap_cold_11();
LAB_0010d7bb:
        pFStack_888 = (FILE *)0x10d7c0;
        pkcs7_unwrap_cold_15();
LAB_0010d7c0:
        pFVar9 = pFVar10;
        pFStack_888 = (FILE *)0x10d7c5;
        pkcs7_unwrap_cold_14();
LAB_0010d7c5:
        pFStack_888 = (FILE *)0x10d7ca;
        pkcs7_unwrap_cold_13();
      }
      else {
        if (v_flag != 0) {
          ppcVar20 = &pname;
          pFStack_888 = (FILE *)0x10d14c;
          printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar2);
          buffer_00 = (EVP_PKEY **)ppcVar20;
        }
        pFStack_888 = (FILE *)0x10d159;
        BIO_set_flags((BIO *)pFVar8,0x200);
        pFVar23 = (FILE *)0x0;
        pFStack_888 = (FILE *)0x10d163;
        pPVar11 = d2i_PKCS7_bio((BIO *)pFVar8,(PKCS7 **)0x0);
        pFVar16->__pad5 = (size_t)pPVar11;
        if (d_flag != 0) {
          pFStack_888 = (FILE *)0x10d18e;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pFVar23 = (FILE *)pFVar16->__pad5;
          pFStack_888 = (FILE *)0x10d1a4;
          PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar23);
        }
        pcVar24 = *(char **)(pFVar16->__pad5 + 0x18);
        pFStack_888 = (FILE *)0x10d1b4;
        iVar3 = OBJ_obj2nid((ASN1_OBJECT *)pcVar24);
        if (iVar3 != 0x16) goto LAB_0010d77a;
        pcVar24 = (char *)pFVar16->__pad5;
        pFVar23 = (FILE *)0x0;
        pFStack_888 = (FILE *)0x10d1cb;
        b_00 = (FILE *)PKCS7_dataInit((PKCS7 *)pcVar24,(BIO *)0x0);
        if (b_00 == (FILE *)0x0) goto LAB_0010d77f;
        pFStack_888 = (FILE *)0x10d1dc;
        pBVar4 = BIO_s_mem();
        pFStack_888 = (FILE *)0x10d1e4;
        pFVar8 = (FILE *)BIO_new(pBVar4);
        pFStack_888 = (FILE *)0x10d1f9;
        uVar2 = BIO_read((BIO *)b_00,auStack_878 + 8,0x400);
        pFVar23 = (FILE *)(ulong)uVar2;
        pFVar10 = pFVar23;
        if (0 < (int)uVar2) {
          pFVar9 = (FILE *)(auStack_878 + 8);
          do {
            pFStack_888 = (FILE *)0x10d213;
            BIO_write((BIO *)pFVar8,pFVar9,(int)pFVar23);
            pFStack_888 = (FILE *)0x10d223;
            uVar2 = BIO_read((BIO *)b_00,pFVar9,0x400);
            pFVar23 = (FILE *)(ulong)uVar2;
            pFVar10 = (FILE *)(ulong)((int)pFVar10 + uVar2);
          } while (0 < (int)uVar2);
        }
        pFVar23 = (FILE *)0xb;
        buffer_00 = (EVP_PKEY **)0x0;
        pFStack_888 = (FILE *)0x10d23a;
        BIO_ctrl((BIO *)pFVar8,0xb,0,(void *)0x0);
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d25b;
          pFVar23 = (FILE *)pname;
          printf("%s: PKCS#7 contains %d bytes of enveloped data\n",pname,pFVar10);
        }
        pcVar24 = (char *)pFVar16->__pad5;
        pFStack_888 = (FILE *)0x10d267;
        psVar7 = PKCS7_get_signer_info((PKCS7 *)pcVar24);
        b = (char **)b_00;
        if (psVar7 == (stack_st_PKCS7_SIGNER_INFO *)0x0) goto LAB_0010d784;
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d292;
          printf("%s: verifying signature\n",pname);
        }
        pFStack_888 = (FILE *)0x10d29c;
        pFVar9 = (FILE *)OPENSSL_sk_value(psVar7,0);
        pFVar23 = (FILE *)pFVar16->__pad5;
        pFStack_888 = (FILE *)0x10d2bb;
        buffer_00 = (EVP_PKEY **)cacert;
        pcVar24 = (char *)b_00;
        iVar3 = PKCS7_signatureVerify
                          ((BIO *)b_00,(PKCS7 *)pFVar23,(PKCS7_SIGNER_INFO *)pFVar9,(X509 *)cacert);
        if (iVar3 < 1) goto LAB_0010d789;
        if (v_flag != 0) {
          pcVar24 = "%s: signature ok\n";
          pFStack_888 = (FILE *)0x10d2e2;
          pFVar23 = (FILE *)pname;
          printf("%s: signature ok\n");
        }
        if (d_flag != 0) {
          pcVar24 = "%s: finding signed attributes\n";
          pFStack_888 = (FILE *)0x10d306;
          pFVar23 = (FILE *)pname;
          printf("%s: finding signed attributes\n");
        }
        b = (char **)pFVar9->_IO_read_base;
        if ((FILE *)b == (FILE *)0x0) goto LAB_0010d78e;
        pFVar23 = (FILE *)(ulong)(uint)nid_transId;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d32f;
        pcVar24 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_transId,0x13,(char **)buffer_00);
        pcVar25 = (char *)auStack_878._0_8_;
        if (iVar3 != 0) goto LAB_0010d793;
        pFStack_888 = (FILE *)0x10d357;
        printf("%s: reply transaction id: %s\n",pname,auStack_878._0_8_);
        cert = (int *)pFVar16->_IO_buf_end;
        pFStack_888 = (FILE *)0x10d363;
        __n = strlen(pcVar25);
        pFStack_888 = (FILE *)0x10d371;
        pFVar23 = (FILE *)pcVar25;
        pcVar24 = (char *)cert;
        iVar3 = strncmp((char *)cert,pcVar25,__n);
        if (iVar3 != 0) goto LAB_0010d798;
        pFVar23 = (FILE *)(ulong)(uint)nid_messageType;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d394;
        pcVar24 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_messageType,0x13,(char **)buffer_00);
        cert = &v_flag;
        if (iVar3 != 0) goto LAB_0010d79d;
        pFStack_888 = (FILE *)0x10d3ad;
        pcVar24 = (char *)auStack_878._0_8_;
        iVar3 = atoi((char *)auStack_878._0_8_);
        if (iVar3 != 3) goto LAB_0010d7a2;
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d3d5;
          printf("%s: reply message type is good\n",pname);
        }
        pFStack_888 = (FILE *)0x10d3f0;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_senderNonce,4,(char **)auStack_878);
        if ((iVar3 != 0) && (v_flag != 0)) {
          pFStack_888 = (FILE *)0x10d766;
          pkcs7_unwrap_cold_6();
        }
        pFVar16->_markers = (_IO_marker *)auStack_878._0_8_;
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d427;
          printf("%s: senderNonce in reply: ",pname);
          pcVar25 = "%02X";
          lVar27 = 0;
          do {
            pFStack_888 = (FILE *)0x10d444;
            printf("%02X",(ulong)*(byte *)((long)&pFVar16->_markers->_next + lVar27));
            lVar27 = lVar27 + 1;
          } while (lVar27 != 0x10);
          pFStack_888 = (FILE *)0x10d457;
          putchar(10);
        }
        cert = &v_flag;
        pFVar23 = (FILE *)(ulong)(uint)nid_recipientNonce;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d479;
        pcVar24 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_recipientNonce,4,(char **)buffer_00);
        if (iVar3 != 0) goto LAB_0010d7a7;
        pFVar16->_IO_save_end = (char *)auStack_878._0_8_;
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d4a9;
          printf("%s: recipientNonce in reply: ",pname);
          lVar27 = 0;
          do {
            pFStack_888 = (FILE *)0x10d4c6;
            printf("%02X",(ulong)(byte)pFVar16->_IO_save_end[lVar27]);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 0x10);
          pFStack_888 = (FILE *)0x10d4d9;
          putchar(10);
        }
        cert = &v_flag;
        pcVar25 = (char *)&pFVar16->_mode;
        lVar27 = 0;
        do {
          if (pFVar16->_IO_save_base[lVar27] != pFVar16->_IO_save_end[lVar27]) {
            if (v_flag != 0) {
              pFStack_888 = (FILE *)0x10d770;
              pkcs7_unwrap_cold_8();
            }
            break;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x10);
        pFVar23 = (FILE *)(ulong)(uint)nid_pkiStatus;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d52c;
        pcVar24 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_pkiStatus,0x13,(char **)buffer_00);
        if (iVar3 != 0) goto LAB_0010d7ac;
        pFStack_888 = (FILE *)0x10d53e;
        pcVar24 = (char *)auStack_878._0_8_;
        uVar2 = atoi((char *)auStack_878._0_8_);
        cert = (int *)(ulong)uVar2;
        if (uVar2 == 0) {
          pcVar24 = "%s: pkistatus: SUCCESS\n";
LAB_0010d56e:
          pFStack_888 = (FILE *)0x10d57f;
          pFVar23 = (FILE *)pname;
          printf(pcVar24);
          *(uint *)&pFVar16->_IO_write_base = uVar2;
          cert = &v_flag;
          if (uVar2 == 2) {
            pFVar23 = (FILE *)(ulong)(uint)nid_failInfo;
            buffer_00 = (EVP_PKEY **)auStack_878;
            pFStack_888 = (FILE *)0x10d5ab;
            pcVar24 = (char *)b;
            iVar3 = get_signed_attribute
                              ((stack_st_X509_ATTRIBUTE *)b,nid_failInfo,0x13,(char **)buffer_00);
            if (iVar3 != 0) goto LAB_0010d7b1;
            pFStack_888 = (FILE *)0x10d5bd;
            uVar2 = atoi((char *)auStack_878._0_8_);
            pcVar24 = (char *)auStack_878._0_8_;
            if (uVar2 < 5) {
              buffer_00 = (EVP_PKEY **)(ulong)uVar2;
              iVar3 = *(int *)(&DAT_0011144c + (long)buffer_00 * 4);
              *(uint *)&pFVar16->_IO_write_end = uVar2;
              pcVar24 = "%s: reason: %s\n";
              pFStack_888 = (FILE *)0x10d5f1;
              pFVar23 = (FILE *)pname;
              printf("%s: reason: %s\n",pname,&DAT_0011144c + iVar3);
              goto LAB_0010d5f1;
            }
            goto LAB_0010d7b6;
          }
LAB_0010d5f1:
          if (*(int *)&pFVar16->_IO_write_base != 0) {
            if ((v_flag != 0) && ((int)pFVar10 != 0)) {
              pFStack_888 = (FILE *)0x10d60f;
              pkcs7_unwrap_cold_12();
            }
            return 0;
          }
          if ((int)pFVar10 == 0) goto LAB_0010d7bb;
          if (pFVar16->_flags - 0x13U < 2) {
            ppXVar12 = (X509 **)&pFVar16->_fileno;
            buffer_00 = (EVP_PKEY **)&pFVar16->_old_offset;
          }
          else {
            ppXVar12 = &localcert;
            buffer_00 = &rsa;
          }
          b = (char **)*buffer_00;
          cert = (int *)*ppXVar12;
          pFVar23 = (FILE *)0x0;
          pFStack_888 = (FILE *)0x10d64e;
          pcVar24 = (char *)pFVar8;
          pFVar9 = (FILE *)d2i_PKCS7_bio((BIO *)pFVar8,(PKCS7 **)0x0);
          if (pFVar9 == (FILE *)0x0) goto LAB_0010d7c0;
          if (d_flag != 0) {
            pFStack_888 = (FILE *)0x10d67e;
            printf("%s: printing PEM fomatted PKCS#7\n",pname);
            pFStack_888 = (FILE *)0x10d690;
            PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar9);
          }
          pFStack_888 = (FILE *)0x10d695;
          pBVar4 = BIO_s_mem();
          pFStack_888 = (FILE *)0x10d69d;
          pFVar8 = (FILE *)BIO_new(pBVar4);
          if (d_flag != 0) {
            pFStack_888 = (FILE *)0x10d6c4;
            printf("%s: decrypting inner PKCS#7\n",pname);
          }
          pFStack_888 = (FILE *)0x10d6d8;
          buffer_00 = (EVP_PKEY **)pFVar8;
          pFVar23 = (FILE *)b;
          pcVar24 = (char *)pFVar9;
          iVar3 = PKCS7_decrypt((PKCS7 *)pFVar9,(EVP_PKEY *)b,(X509 *)cert,(BIO *)pFVar8,0);
          if (iVar3 != 0) {
            pFStack_888 = (FILE *)0x10d6f1;
            BIO_ctrl((BIO *)pFVar8,0xb,0,(void *)0x0);
            pFStack_888 = (FILE *)0x10d703;
            uVar13 = BIO_ctrl((BIO *)pFVar8,3,0,pcVar25);
            *(int *)(pFVar16->_unused2 + 4) = (int)uVar13;
            if (v_flag != 0) {
              pFStack_888 = (FILE *)0x10d72f;
              printf("%s: PKCS#7 payload size: %d bytes\n",pname,uVar13 & 0xffffffff);
            }
            pFStack_888 = (FILE *)0x10d73c;
            BIO_set_flags((BIO *)pFVar8,0x200);
            pFStack_888 = (FILE *)0x10d746;
            pPVar11 = d2i_PKCS7_bio((BIO *)pFVar8,(PKCS7 **)0x0);
            pFVar16->__pad5 = (size_t)pPVar11;
            return 0;
          }
          goto LAB_0010d7c5;
        }
        if (uVar2 == 3) {
          pcVar24 = "%s: pkistatus: PENDING\n";
          goto LAB_0010d56e;
        }
        pFVar9 = pFVar10;
        if (uVar2 == 2) {
          pcVar24 = "%s: pkistatus: FAILURE\n";
          goto LAB_0010d56e;
        }
      }
      pFStack_888 = (FILE *)get_signed_attribute;
      pkcs7_unwrap_cold_16();
      pcStack_8c0 = (code *)0x10d7ea;
      pFStack_8a8 = pFVar16;
      pFStack_8a0 = (FILE *)pcVar25;
      pFStack_898 = pFVar8;
      pFStack_890 = (FILE *)b;
      pFStack_888 = pFVar9;
      iVar3 = get_attribute((stack_st_X509_ATTRIBUTE *)pcVar24,(int)pFVar23,
                            (ASN1_TYPE **)&pFStack_8b0);
      if (iVar3 != 0) {
        if (v_flag == 0) {
          return 1;
        }
        pcStack_8c0 = (code *)0x10d8bf;
        get_signed_attribute_cold_1();
        return 1;
      }
      pcStack_8c0 = (code *)0x10d821;
      ppcVar20 = (char **)pFStack_8b0;
      uVar2 = ASN1_TYPE_get((ASN1_TYPE *)pFStack_8b0);
      if (uVar2 == extraout_EDX) {
        pcStack_8c0 = (code *)0x10d832;
        uVar2 = ASN1_STRING_length((ASN1_STRING *)pFStack_8b0->_IO_read_ptr);
        if ((int)uVar2 < 1) {
          return 1;
        }
        b = (char **)(ulong)uVar2;
        if (d_flag != 0) {
          pcStack_8c0 = (code *)0x10d860;
          pFVar23 = (FILE *)pname;
          printf("%s: allocating %d bytes for attribute\n",pname,b);
        }
        ppcVar20 = (char **)(ulong)((extraout_EDX == 0x13) + uVar2);
        pcStack_8c0 = (code *)0x10d871;
        pcVar24 = (char *)malloc((size_t)ppcVar20);
        *buffer_00 = (EVP_PKEY *)pcVar24;
        if (pcVar24 != (char *)0x0) {
          pcStack_8c0 = (code *)0x10d885;
          __src = (void *)ASN1_STRING_get0_data((X509_ALGOR *)pFStack_8b0->_IO_read_ptr);
          pcStack_8c0 = (code *)0x10d896;
          memcpy(pcVar24,__src,(size_t)b);
          if (extraout_EDX != 0x13) {
            return 0;
          }
          (*buffer_00)[(long)b] = (EVP_PKEY)0x0;
          return 0;
        }
      }
      else {
        pcStack_8c0 = (code *)0x10d8c9;
        get_signed_attribute_cold_2();
      }
      pcStack_8c0 = get_attribute;
      get_signed_attribute_cold_3();
      pcVar24 = pname;
      pFStack_8d0 = pFStack_8b0;
      pFVar9 = (FILE *)((ulong)pFVar23 & 0xffffffff);
      pFStack_8e0 = (FILE *)buffer_00;
      pFStack_8d8 = (FILE *)pcVar25;
      pFStack_8c8 = (FILE *)b;
      pcStack_8c0 = (code *)(ulong)extraout_EDX;
      if (d_flag != 0) {
        pFStack_8e8 = (FILE *)0x10d8fb;
        pcVar14 = OBJ_nid2sn((int)pFVar23);
        pFStack_8e8 = (FILE *)0x10d90f;
        printf("%s: finding attribute %s\n",pcVar24,pcVar14);
        b = (char **)pcVar24;
      }
      *(long *)extraout_RDX = 0;
      pFStack_8e8 = (FILE *)0x10d91d;
      pFVar8 = pFVar9;
      pFVar10 = (FILE *)OBJ_nid2obj((int)pFVar23);
      if (pFVar10 != (FILE *)0x0) {
        pFStack_8e8 = (FILE *)0x10d92d;
        iVar3 = OPENSSL_sk_num(ppcVar20);
        if (0 < iVar3) {
          pFVar9 = (FILE *)0x0;
          do {
            pFStack_8e8 = (FILE *)0x10d93d;
            pcVar25 = (char *)OPENSSL_sk_value(ppcVar20,pFVar9);
            pFStack_8e8 = (FILE *)0x10d948;
            a = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)pcVar25);
            pFStack_8e8 = (FILE *)0x10d953;
            iVar3 = OBJ_cmp(a,(ASN1_OBJECT *)pFVar10);
            if (iVar3 == 0) {
              pFStack_8e8 = (FILE *)0x10d95f;
              pFVar8 = (FILE *)pcVar25;
              iVar3 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)pcVar25);
              if (iVar3 != 0) {
                if (*(long *)extraout_RDX != 0) {
                  pFStack_8e8 = (FILE *)0x10d99b;
                  get_attribute_cold_1();
                  b = (char **)pFVar10;
                  goto LAB_0010d99b;
                }
                pFStack_8e8 = (FILE *)0x10d973;
                pAVar15 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)pcVar25,0);
                *(ASN1_TYPE **)extraout_RDX = pAVar15;
              }
            }
            uVar2 = (int)pFVar9 + 1;
            pFVar9 = (FILE *)(ulong)uVar2;
            pFStack_8e8 = (FILE *)0x10d980;
            iVar3 = OPENSSL_sk_num(ppcVar20);
          } while ((int)uVar2 < iVar3);
        }
        return (int)(*(long *)extraout_RDX == 0);
      }
LAB_0010d99b:
      pFStack_8e8 = (FILE *)write_crl;
      get_attribute_cold_2();
      pFVar8 = *(FILE **)(*(long *)(pFVar8->__pad5 + 0x20) + 0x18);
      pFStack_900 = (FILE *)0x10d9bb;
      pFStack_8f0 = (FILE *)ppcVar20;
      pFStack_8e8 = (FILE *)b;
      pFVar10 = (FILE *)OPENSSL_sk_value(pFVar8,0);
      if (pFVar10 == (FILE *)0x0) {
        pFStack_900 = (FILE *)0x10da68;
        write_crl_cold_3();
LAB_0010da68:
        pFStack_900 = (FILE *)0x10da6d;
        write_crl_cold_2();
        pFVar16 = extraout_RDX;
      }
      else {
        b = &w_char;
        pFStack_900 = (FILE *)0x10d9dd;
        pFVar8 = (FILE *)w_char;
        pFVar16 = fopen(w_char,"w");
        ppcVar20 = (char **)pFVar10;
        if (pFVar16 == (FILE *)0x0) goto LAB_0010da68;
        if (v_flag != 0) {
          pFStack_900 = (FILE *)0x10da0d;
          printf("%s: writing CRL\n",pname);
        }
        if (d_flag != 0) {
          pFStack_900 = (FILE *)0x10da2b;
          PEM_write_X509_CRL(_stdout,(X509_CRL *)pFVar10);
        }
        pFStack_900 = (FILE *)0x10da36;
        pFVar8 = pFVar16;
        iVar3 = PEM_write_X509_CRL(pFVar16,(X509_CRL *)pFVar10);
        if (iVar3 == 1) {
          pFStack_900 = (FILE *)0x10da56;
          printf("%s: CRL written as %s\n",pname,w_char);
          iVar3 = fclose(pFVar16);
          return iVar3;
        }
      }
      pFStack_900 = (FILE *)write_local_cert;
      write_crl_cold_1();
      localcert = (X509 *)0x0;
      pFVar8 = *(FILE **)(*(long *)(pFVar8->__pad5 + 0x20) + 0x10);
      piVar26 = &v_flag;
      pFStack_928 = pFVar16;
      pFStack_920 = (FILE *)pcVar25;
      pFStack_918 = (FILE *)cert;
      pFStack_910 = (FILE *)ppcVar20;
      pFStack_908 = (FILE *)b;
      pFStack_900 = pFVar9;
      if (v_flag != 0) {
        pFStack_1938 = (FILE *)0x10dab3;
        uVar2 = OPENSSL_sk_num(pFVar8);
        pFStack_1938 = (FILE *)0x10dac3;
        printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar2);
      }
      pFStack_1938 = (FILE *)0x10dacb;
      pFVar10 = pFVar8;
      iVar3 = OPENSSL_sk_num();
      pFVar16 = (FILE *)localcert;
      if (0 < iVar3) {
        ppcVar20 = (char **)0x0;
        do {
          pFStack_1938 = (FILE *)0x10dae1;
          cert = (int *)OPENSSL_sk_value(pFVar8,ppcVar20);
          pcVar24 = pname;
          if (v_flag != 0) {
            pFStack_1938 = (FILE *)0x10db01;
            pXVar17 = X509_get_subject_name((X509 *)cert);
            pFStack_1938 = (FILE *)0x10db14;
            pcVar25 = X509_NAME_oneline(pXVar17,(char *)aFStack_1930,0x400);
            pFStack_1938 = (FILE *)0x10db28;
            printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar24,pcVar25);
            pFStack_1938 = (FILE *)0x10db30;
            pXVar17 = X509_get_issuer_name((X509 *)cert);
            pFStack_1938 = (FILE *)0x10db40;
            pcVar24 = X509_NAME_oneline(pXVar17,(char *)aFStack_1930,0x400);
            pFStack_1938 = (FILE *)0x10db51;
            printf("  issuer: %s\n",pcVar24);
            pFStack_1938 = (FILE *)0x10db5d;
            pXVar17 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFStack_1938 = (FILE *)0x10db6d;
            pcVar24 = X509_NAME_oneline(pXVar17,(char *)aFStack_1930,0x400);
            pFStack_1938 = (FILE *)0x10db7e;
            printf("  request_subject: \'%s\'\n",pcVar24);
            pFVar9 = aFStack_1930;
          }
          pFStack_1938 = (FILE *)0x10db86;
          pXVar17 = X509_get_subject_name((X509 *)cert);
          pFStack_1938 = (FILE *)0x10db95;
          b_01 = (X509_NAME *)X509_REQ_get_subject_name(request);
          pFStack_1938 = (FILE *)0x10dba0;
          iVar3 = X509_NAME_cmp(pXVar17,b_01);
          if (d_flag != 0) {
            pFStack_1938 = (FILE *)0x10dc81;
            write_local_cert_cold_1();
          }
          if (iVar3 == 0) {
LAB_0010dc26:
            if (v_flag != 0) {
              pFStack_1938 = (FILE *)0x10dc39;
              puts("CN\'s of request and certificate matched!");
            }
          }
          else {
            pFStack_1938 = (FILE *)0x10dbc0;
            pXVar17 = X509_get_subject_name((X509 *)cert);
            pFStack_1938 = (FILE *)0x10dbd8;
            X509_NAME_oneline(pXVar17,acStack_1130,0x400);
            pFStack_1938 = (FILE *)0x10dbe4;
            pXVar17 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFVar9 = aFStack_1530;
            pFStack_1938 = (FILE *)0x10dbfc;
            X509_NAME_oneline(pXVar17,(char *)pFVar9,0x400);
            if (v_flag != 0) {
              pFStack_1938 = (FILE *)0x10dc17;
              printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n"
                     ,pFVar9,acStack_1130);
            }
            pFStack_1938 = (FILE *)0x10dc22;
            iVar3 = strcmp(acStack_1130,(char *)pFVar9);
            if (iVar3 == 0) goto LAB_0010dc26;
            pFStack_1938 = (FILE *)0x10dc8b;
            write_local_cert_cold_2();
          }
          pFStack_1938 = (FILE *)0x10dc41;
          b = (char **)X509_get_subject_name((X509 *)cert);
          pFStack_1938 = (FILE *)0x10dc4c;
          pXVar17 = X509_get_issuer_name((X509 *)cert);
          pFStack_1938 = (FILE *)0x10dc57;
          pFVar10 = (FILE *)b;
          iVar3 = X509_NAME_cmp((X509_NAME *)b,pXVar17);
          pFVar16 = (FILE *)cert;
          if (iVar3 != 0) break;
          uVar2 = (int)ppcVar20 + 1;
          ppcVar20 = (char **)(ulong)uVar2;
          pFStack_1938 = (FILE *)0x10dc66;
          pFVar10 = pFVar8;
          iVar3 = OPENSSL_sk_num();
          pFVar16 = (FILE *)localcert;
        } while ((int)uVar2 < iVar3);
      }
      localcert = (X509 *)pFVar16;
      if (localcert == (X509 *)0x0) {
        pFStack_1938 = (FILE *)0x10dd37;
        write_local_cert_cold_5();
LAB_0010dd37:
        pFStack_1938 = (FILE *)0x10dd3c;
        write_local_cert_cold_4();
      }
      else {
        ppcVar20 = &l_char;
        pFStack_1938 = (FILE *)0x10dcb8;
        pFVar10 = (FILE *)l_char;
        pFVar16 = fopen(l_char,"w");
        if (pFVar16 == (FILE *)0x0) goto LAB_0010dd37;
        if (v_flag != 0) {
          pFStack_1938 = (FILE *)0x10dce2;
          printf("%s: certificate written as %s\n",pname,l_char);
        }
        if (d_flag != 0) {
          pFStack_1938 = (FILE *)0x10dd04;
          PEM_write_X509(_stdout,(X509 *)localcert);
        }
        pFStack_1938 = (FILE *)0x10dd13;
        pFVar10 = pFVar16;
        iVar3 = PEM_write_X509(pFVar16,(X509 *)localcert);
        pFVar8 = pFVar16;
        if (iVar3 == 1) {
          pFStack_1938 = (FILE *)0x10dd20;
          iVar3 = fclose(pFVar16);
          return iVar3;
        }
      }
      pFStack_1938 = (FILE *)write_other_cert;
      write_local_cert_cold_3();
      piStack_1958 = &v_flag;
      ppcVar28 = *(char ***)(*(long *)(pFVar10->__pad5 + 0x20) + 0x10);
      pFStack_1d80 = (FILE *)0x10dd6e;
      pFVar16 = (FILE *)ppcVar28;
      pFStack_1d70 = pFVar10;
      pFStack_1960 = pFVar8;
      pFStack_1950 = (FILE *)cert;
      pFStack_1948 = (FILE *)ppcVar20;
      pFStack_1940 = (FILE *)b;
      pFStack_1938 = pFVar9;
      iVar3 = OPENSSL_sk_num();
      pFVar8 = (FILE *)0x0;
      if (0 < iVar3) {
        cert = (int *)0x0;
        do {
          pFStack_1d80 = (FILE *)0x10dd86;
          pFVar9 = (FILE *)OPENSSL_sk_value(ppcVar28,cert);
          pcVar24 = pname;
          if (v_flag != 0) {
            pFStack_1d80 = (FILE *)0x10dda7;
            pXVar17 = X509_get_subject_name((X509 *)pFVar9);
            ppcVar20 = (char **)aFStack_1d68;
            pFStack_1d80 = (FILE *)0x10ddbc;
            pcVar25 = X509_NAME_oneline(pXVar17,(char *)ppcVar20,0x400);
            pFStack_1d80 = (FILE *)0x10ddd0;
            printf("%s: found certificate with\n  subject: %s\n",pcVar24,pcVar25);
            pFStack_1d80 = (FILE *)0x10ddd8;
            pXVar17 = X509_get_issuer_name((X509 *)pFVar9);
            pFStack_1d80 = (FILE *)0x10dde8;
            pcVar25 = X509_NAME_oneline(pXVar17,(char *)ppcVar20,0x400);
            pFStack_1d80 = (FILE *)0x10ddf9;
            printf("  issuer: %s\n",pcVar25);
            piVar26 = (int *)pcVar24;
          }
          pFStack_1d80 = (FILE *)0x10de01;
          pFVar16 = (FILE *)X509_get_serialNumber((X509 *)pFVar9);
          pFStack_1d80 = (FILE *)0x10de19;
          iVar3 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pFVar16,
                                   *(ASN1_INTEGER **)((long)pFStack_1d70->__pad3 + 8));
          pFVar8 = pFVar9;
          if (iVar3 == 0) break;
          uVar2 = (int)cert + 1;
          cert = (int *)(ulong)uVar2;
          pFStack_1d80 = (FILE *)0x10de2c;
          pFVar16 = (FILE *)ppcVar28;
          iVar3 = OPENSSL_sk_num();
          pFVar8 = (FILE *)0x0;
        } while ((int)uVar2 < iVar3);
      }
      if (pFVar8 == (FILE *)0x0) {
        pFStack_1d80 = (FILE *)0x10ded0;
        write_other_cert_cold_3();
      }
      else {
        ppcVar28 = &w_char;
        pFStack_1d80 = (FILE *)0x10de54;
        pFVar16 = (FILE *)w_char;
        pFVar10 = fopen(w_char,"w");
        if (pFVar10 != (FILE *)0x0) {
          if (v_flag != 0) {
            pFStack_1d80 = (FILE *)0x10de83;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          if (d_flag != 0) {
            pFStack_1d80 = (FILE *)0x10dea1;
            PEM_write_X509(_stdout,(X509 *)pFVar8);
          }
          pFStack_1d80 = (FILE *)0x10deac;
          pFVar16 = pFVar10;
          iVar3 = PEM_write_X509(pFVar10,(X509 *)pFVar8);
          ppcVar20 = (char **)pFVar10;
          if (iVar3 == 1) {
            pFStack_1d80 = (FILE *)0x10deb9;
            iVar3 = fclose(pFVar10);
            return iVar3;
          }
          goto LAB_0010ded5;
        }
      }
      pFStack_1d80 = (FILE *)0x10ded5;
      write_other_cert_cold_2();
LAB_0010ded5:
      pFStack_1d80 = (FILE *)write_ca_ra;
      write_other_cert_cold_1();
      pFStack_1da8 = pFVar8;
      piStack_1da0 = piVar26;
      pFStack_1d98 = (FILE *)cert;
      pFStack_1d90 = (FILE *)ppcVar20;
      pFStack_1d88 = (FILE *)ppcVar28;
      pFStack_1d80 = pFVar9;
      pBVar5 = BIO_new_mem_buf(pFVar16->_IO_read_end,*(int *)&pFVar16->_IO_read_base);
      pPVar11 = d2i_PKCS7_bio(pBVar5,(PKCS7 **)0x0);
      if (pPVar11 == (PKCS7 *)0x0) {
        pcVar24 = "%s: error reading PKCS#7 data\n";
LAB_0010df27:
        fprintf(_stderr,pcVar24,pname);
LAB_0010df31:
        ERR_print_errors_fp(_stderr);
      }
      else {
        iVar3 = OBJ_obj2nid(pPVar11->type);
        if (iVar3 == 0x16) {
          lVar27 = ((pPVar11->d).data)->flags;
          if (lVar27 != 0) {
            pPStack_2608 = pPVar11;
            pBStack_2600 = pBVar5;
            iVar3 = OPENSSL_sk_num(lVar27);
            if (0 < iVar3) {
              uVar13 = 0;
              lStack_25f8 = lVar27;
              do {
                memset(acStack_25b0,0,0x400);
                memset(acStack_21b0,0,0x400);
                a_00 = (X509 *)OPENSSL_sk_value(lVar27,uVar13);
                snprintf(acStack_21b0,0x400,"%s-%d",c_char,uVar13);
                pcVar24 = pname;
                if (v_flag != 0) {
                  pXVar17 = X509_get_subject_name(a_00);
                  pcVar25 = X509_NAME_oneline(pXVar17,acStack_25b0,0x400);
                  printf("\n%s: found certificate with\n  subject: %s\n",pcVar24,pcVar25);
                }
                if (v_flag != 0) {
                  pXVar17 = X509_get_issuer_name(a_00);
                  pcVar24 = X509_NAME_oneline(pXVar17,acStack_25b0,0x400);
                  printf("  issuer: %s\n",pcVar24);
                }
                iVar3 = X509_digest(a_00,(EVP_MD *)fp_alg,abStack_25f0,&uStack_260c);
                if (iVar3 == 0) goto LAB_0010df31;
                iVar3 = X509_get_ext_by_NID(a_00,0x57,-1);
                if (iVar3 < 0) {
                  if (v_flag != 0) {
                    puts("  basic constraints: (not included)");
                  }
                }
                else {
                  pXVar18 = X509_get_ext(a_00,iVar3);
                  if (v_flag != 0) {
                    printf("  basic constraints: ");
                    X509V3_EXT_print_fp(_stdout,pXVar18,0,0);
                    putchar(10);
                  }
                }
                iVar3 = X509_get_ext_by_NID(a_00,0x53,-1);
                if (iVar3 < 0) {
                  if (v_flag != 0) {
                    puts("  usage: (not included)");
                  }
                }
                else {
                  pXVar18 = X509_get_ext(a_00,iVar3);
                  if (v_flag != 0) {
                    printf("  usage: ");
                    X509V3_EXT_print_fp(_stdout,pXVar18,0,0);
                    putchar(10);
                  }
                }
                if (v_flag != 0) {
                  iVar3 = EVP_MD_get_type(fp_alg);
                  pcVar24 = OBJ_nid2sn(iVar3);
                  printf("  %s fingerprint: ",pcVar24);
                  uVar21 = (ulong)uStack_260c;
                  if (0 < (int)uStack_260c) {
                    uVar19 = 0;
                    do {
                      uVar1 = uVar19 + 1;
                      uVar22 = 10;
                      if (uVar1 != (uVar21 & 0xffffffff)) {
                        uVar22 = 0x3a;
                      }
                      printf("%02X%c",(ulong)abStack_25f0[uVar19],uVar22);
                      uVar21 = (ulong)(int)uStack_260c;
                      uVar19 = uVar1;
                    } while ((long)uVar1 < (long)uVar21);
                  }
                }
                pFVar9 = fopen(acStack_21b0,"w");
                if (pFVar9 == (FILE *)0x0) {
                  pcVar24 = "%s: cannot open cert file for writing\n";
                  goto LAB_0010df71;
                }
                if (v_flag != 0) {
                  printf("%s: certificate written as %s\n",pname,acStack_21b0);
                }
                if (d_flag != 0) {
                  PEM_write_X509(_stdout,a_00);
                }
                iVar3 = PEM_write_X509(pFVar9,a_00);
                if (iVar3 != 1) {
                  pcVar24 = "%s: error while writing certificate file\n";
                  goto LAB_0010df27;
                }
                fclose(pFVar9);
                lVar27 = lStack_25f8;
                uVar2 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar2;
                iVar3 = OPENSSL_sk_num(lStack_25f8);
              } while ((int)uVar2 < iVar3);
            }
            PKCS7_free(pPStack_2608);
            BIO_free(pBStack_2600);
            exit(0);
          }
          pcVar24 = "%s: cannot find certificates\n";
LAB_0010df71:
          fprintf(_stderr,pcVar24,pname);
        }
        else {
          printf("%s: wrong PKCS#7 type\n",pname);
        }
      }
      exit(0x5d);
    }
  }
  pFStack_440 = (FILE *)0x10d084;
  pkcs7_verify_unwrap_cold_9();
LAB_0010d084:
  pFStack_440 = (FILE *)0x10d09c;
  printf("%s: error verifying signature Error \n",pname);
  pFStack_440 = (FILE *)0x10d0ab;
  ERR_print_errors_fp(_stderr);
  pFStack_440 = (FILE *)0x10d0b5;
  exit(0x61);
}

Assistant:

int pkcs7_verify_unwrap(struct scep *s , char * cachainfile ) {
	BIO				*memorybio;
	BIO				*outbio;
	BIO				*pkcs7bio;
	int				len, bytes, used;
	STACK_OF(PKCS7_SIGNER_INFO)	*sk;
	PKCS7_SIGNER_INFO		*si;
	unsigned char			buffer[1024];
    X509   				*signercert;
    FILE 				*fp;

    X509_STORE_CTX 		*cert_ctx;

	X509_STORE *cert_store=NULL;


	/* Create new memory BIO for outer PKCS#7 */
	memorybio = BIO_new(BIO_s_mem());

	/* Read in data */
	if (v_flag)
		printf("%s: reading outer PKCS#7\n",pname);
	if ((len = BIO_write(memorybio, s->reply_payload, s->reply_len)) <= 0) {
		fprintf(stderr, "%s: error reading PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: PKCS#7 payload size: %d bytes\n", pname, len);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	s->reply_p7 = d2i_PKCS7_bio(memorybio, NULL);
	if (!s->reply_p7) {
		fprintf(stderr, "%s: Error in d2i_PKCS7_bio.\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, s->reply_p7);
	}

	 /* Make sure this is a signed PKCS#7 */
        if (!PKCS7_type_is_signed(s->reply_p7)) {
		fprintf(stderr, "%s: PKCS#7 is not signed!\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
        }

	/* Create BIO for content data */
	pkcs7bio = PKCS7_dataInit(s->reply_p7, NULL);
	if (pkcs7bio == NULL) {
		fprintf(stderr, "%s: cannot get PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Copy enveloped data from PKCS#7 */
	outbio = BIO_new(BIO_s_mem());
	used = 0;
	for (;;) {
		bytes = BIO_read(pkcs7bio, buffer, sizeof(buffer));
		used += bytes;
		if (bytes <= 0) break;
		BIO_write(outbio, buffer, bytes);
	}
	BIO_flush(outbio);
	if (v_flag)
		printf("%s: PKCS#7 contains %d bytes of signed data\n",
			pname, used);

	/* Get signer */
	sk = PKCS7_get_signer_info(s->reply_p7);
	if (sk == NULL) {
		fprintf(stderr, "%s: cannot get signer info!\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Verify signature */
	if (v_flag)
		printf("%s: verifying signature\n", pname);
	si = sk_PKCS7_SIGNER_INFO_value(sk, 0);

	signercert = PKCS7_cert_from_signer_info(s->reply_p7,si);
	if(signercert == NULL ) printf("%s: Can't read signer cert from pkcs7\n", pname);

//int reson=0;

	if (PKCS7_signatureVerify(pkcs7bio, s->reply_p7, si,signercert ) <= 0) {
		//reson = ERR_GET_REASON(ERR_peek_last_error());
		printf("%s: error verifying signature Error \n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: signature ok\n", pname);

	/*verify certificates*/


	cert_store=X509_STORE_new();
	if(cert_store == NULL)
		fprintf(stderr, "%s: error verifying certificates \n", pname);

	X509_STORE_set_flags(cert_store, 0);

    //X509_STORE_load_locations(cert_store,certsfile,certsdir);
    X509_STORE_load_locations(cert_store,cachainfile,NULL);

    if(!(cert_ctx = X509_STORE_CTX_new())) {;
    fprintf(stderr, "%s: error creating certificate chain \n", pname);
    }

    if(!X509_STORE_CTX_init(cert_ctx,cert_store,signercert,NULL))
    {
    	fprintf(stderr, "%s: error verifying certificates \n", pname);
    }

    //X509_STORE_CTX_set_purpose(cert_ctx, purpose);

    if( !X509_verify_cert(cert_ctx)) {
    	fprintf(stderr, "%s: The signer certificate verification failed \n", pname);
    }

    /*Write pem encoded signer certificate */
	if(w_flag)
	{

#ifdef WIN32
		if ((fopen_s(&fp, w_char, "w")))
#else
		if (!(fp = fopen(w_char, "w")))
#endif
		{
			fprintf(stderr, "%s: cannot open cert file for writing\n",
					w_char);
			exit (SCEP_PKISTATUS_FILE);
		}
		if (v_flag)
			printf("%s: writing cert\n", w_char);
		if (d_flag)
			PEM_write_X509(stdout, signercert);

		if (PEM_write_X509(fp, signercert) != 1) {
			fprintf(stderr, "%s: error while writing certificate "
				"file\n", w_char);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_FILE);
		}else{
			if(v_flag)
			printf("%s: certificate written as %s\n", pname, w_char);
		}

		(void)fclose(fp);
	}
	/* Copy enveloped data into PKCS#7 */
	s->reply_p7 = d2i_PKCS7_bio(outbio, NULL);
	if (!s->reply_p7) {
		fprintf(stderr, "%s: Error in d2i_PKCS7_bio.\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	X509_STORE_free(cert_store);
	X509_STORE_CTX_cleanup(cert_ctx);

	return (0);
}